

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImpl::abort(QNetworkReplyImpl *this)

{
  long lVar1;
  QNetworkReplyImplPrivate *c;
  int in_ESI;
  long in_FS_OFFSET;
  QNetworkReplyImplPrivate *d;
  int in_stack_ffffffffffffffbc;
  QNetworkReplyImplPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyImplPrivate *)this;
  c = d_func((QNetworkReplyImpl *)0x1ec7ea);
  if ((c->state != Finished) && (c->state != Aborted)) {
    if (c->outgoingData != (QIODevice *)0x0) {
      in_ESI = 0;
      QObject::disconnect((QObject *)c->outgoingData,(char *)0x0,(QObject *)this,(char *)0x0);
    }
    if (c->copyDevice != (QIODevice *)0x0) {
      in_ESI = 0;
      QObject::disconnect((QObject *)c->copyDevice,(char *)0x0,(QObject *)this,(char *)0x0);
    }
    QNetworkReply::close((QNetworkReply *)this,in_ESI);
    tr((char *)this,(char *)c,in_stack_ffffffffffffffbc);
    QNetworkReplyImplPrivate::error(this_00,(NetworkError)((ulong)c >> 0x20),(QString *)this);
    QString::~QString((QString *)0x1ec8b4);
    QNetworkReplyImplPrivate::finished(this_00);
    c->state = Aborted;
    if (c->backend != (QNetworkAccessBackend *)0x0) {
      QObject::deleteLater();
      c->backend = (QNetworkAccessBackend *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImpl::abort()
{
    Q_D(QNetworkReplyImpl);
    if (d->state == QNetworkReplyPrivate::Finished || d->state == QNetworkReplyPrivate::Aborted)
        return;

    // stop both upload and download
    if (d->outgoingData)
        disconnect(d->outgoingData, nullptr, this, nullptr);
    if (d->copyDevice)
        disconnect(d->copyDevice, nullptr, this, nullptr);

    QNetworkReply::close();

    // call finished which will emit signals
    d->error(OperationCanceledError, tr("Operation canceled"));
    d->finished();
    d->state = QNetworkReplyPrivate::Aborted;

    // finished may access the backend
    if (d->backend) {
        d->backend->deleteLater();
        d->backend = nullptr;
    }
}